

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHelper.hh
# Opt level: O2

void __thiscall QPDFObjectHelper::QPDFObjectHelper(QPDFObjectHelper *this,QPDFObjectHelper *param_1)

{
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(param_1 + 8));
  *(code **)this = QPDFWriter::write;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x18),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(param_1 + 0x18));
  return;
}

Assistant:

class QPDF_DLL_CLASS QPDFObjectHelper: public qpdf::BaseHandle
{
  public:
    QPDFObjectHelper(QPDFObjectHandle oh) :
        qpdf::BaseHandle(oh.getObj())
    {
    }
    QPDF_DLL
    virtual ~QPDFObjectHelper();
    QPDFObjectHandle
    getObjectHandle()
    {
        return {obj};
    }
    QPDFObjectHandle const
    getObjectHandle() const
    {
        return {obj};
    }

  protected:
    QPDF_DLL_PRIVATE
    QPDFObjectHandle
    oh()
    {
        return {obj};
    }